

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<vec<Clause_*>_>::push(vec<vec<Clause_*>_> *this)

{
  uint uVar1;
  vec<Clause_*> *pvVar2;
  ulong uVar3;
  
  uVar1 = this->cap;
  if (this->sz == uVar1) {
    uVar3 = 2;
    if (1 < uVar1) {
      uVar3 = (ulong)(uVar1 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar3;
    pvVar2 = (vec<Clause_*> *)realloc(this->data,uVar3 << 4);
    this->data = pvVar2;
  }
  uVar1 = this->sz;
  this->sz = uVar1 + 1;
  pvVar2 = this->data + uVar1;
  pvVar2->sz = 0;
  pvVar2->cap = 0;
  pvVar2->data = (Clause **)0x0;
  return;
}

Assistant:

void push() {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T();
	}